

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerMeshless.cpp
# Opt level: O1

void __thiscall
chrono::ChProximityContainerMeshless::AccumulateStep1(ChProximityContainerMeshless *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  long *plVar12;
  long *plVar13;
  uint uVar14;
  _List_node_base *p_Var15;
  uint uVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ChVector<double> d_BA;
  ChVectorN<double,_3> mdist;
  double local_118;
  double local_108;
  double local_f8;
  double dStack_f0;
  double local_e8;
  ulong local_d8;
  void *local_d0;
  void *local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  ulong __n;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  p_Var15 = (this->proximitylist).
            super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var15 != (_List_node_base *)&this->proximitylist) {
    uVar14 = -((uint)((ulong)&local_48 >> 3) & 0x1fffffff) & 7;
    uVar16 = 3;
    if (uVar14 < 3) {
      uVar16 = uVar14;
    }
    __n = (ulong)(uVar16 << 3);
    local_c8 = (void *)((long)&local_48 + __n);
    local_d0 = (void *)((long)&local_f8 + __n);
    local_d8 = __n ^ 0x18;
    do {
      lVar11 = (**(code **)((long)(p_Var15[1]._M_next)->_M_next + 0x18))();
      if (*(long *)(lVar11 + 0x10) == 0) {
        plVar12 = (long *)0x0;
      }
      else {
        plVar12 = (long *)__dynamic_cast(*(long *)(lVar11 + 0x10),&ChContactable::typeinfo,
                                         &fea::ChNodeMeshless::typeinfo,0x50);
      }
      lVar11 = (**(code **)((long)(p_Var15[1]._M_next)->_M_next + 0x20))();
      if (*(long *)(lVar11 + 0x10) == 0) {
        plVar13 = (long *)0x0;
      }
      else {
        plVar13 = (long *)__dynamic_cast(*(long *)(lVar11 + 0x10),&ChContactable::typeinfo,
                                         &fea::ChNodeMeshless::typeinfo,0x50);
      }
      local_78 = (double)plVar12[1];
      local_80 = (double)plVar12[2];
      local_88 = (double)plVar12[3];
      local_90 = (double)plVar13[1];
      local_70 = (double)plVar13[2];
      local_68 = (double)plVar13[3];
      local_a8 = (double)plVar12[0xf];
      local_b0 = (double)plVar12[0x10];
      local_b8 = (double)plVar12[0x11];
      local_c0 = (double)plVar13[0xf];
      local_a0 = (double)plVar13[0x10];
      local_98 = (double)plVar13[0x11];
      local_50 = local_c0 - local_a8;
      local_58 = local_a0 - local_b0;
      dStack_f0 = local_58;
      local_f8 = local_50;
      local_e8 = local_98 - local_b8;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_58 * local_58;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_50;
      auVar17 = vfmadd231sd_fma(auVar17,auVar24,auVar24);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_e8;
      auVar17 = vfmadd231sd_fma(auVar17,auVar27,auVar27);
      local_60 = local_e8;
      if (auVar17._0_8_ < 0.0) {
        dVar18 = sqrt(auVar17._0_8_);
      }
      else {
        auVar17 = vsqrtsd_avx(auVar17,auVar17);
        dVar18 = auVar17._0_8_;
      }
      dVar1 = (double)plVar12[0x55];
      local_118 = 0.0;
      local_108 = 0.0;
      if (dVar18 < dVar1) {
        dVar19 = pow(dVar1,9.0);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar1;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar18 * dVar18;
        auVar17 = vfmsub231sd_fma(auVar20,auVar25,auVar25);
        local_108 = pow(auVar17._0_8_,3.0);
        local_108 = local_108 * (315.0 / (dVar19 * 201.06192982974676));
      }
      dVar1 = (double)plVar13[0x55];
      if (dVar18 < dVar1) {
        dVar19 = pow(dVar1,9.0);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar1;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar18 * dVar18;
        auVar17 = vfmsub231sd_fma(auVar21,auVar26,auVar26);
        local_118 = pow(auVar17._0_8_,3.0);
        local_118 = local_118 * (315.0 / (dVar19 * 201.06192982974676));
      }
      auVar22._0_8_ = (**(code **)(*plVar13 + 0x90))(plVar13);
      auVar22._8_56_ = extraout_var;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_108;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = plVar12[0x54];
      auVar17 = vfmadd213sd_fma(auVar22._0_16_,auVar10,auVar2);
      plVar12[0x54] = auVar17._0_8_;
      auVar23._0_8_ = (**(code **)(*plVar12 + 0x90))(plVar12);
      auVar23._8_56_ = extraout_var_00;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_118;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = plVar13[0x54];
      auVar17 = vfmadd213sd_fma(auVar23._0_16_,auVar9,auVar3);
      plVar13[0x54] = auVar17._0_8_;
      if (uVar14 != 0) {
        memcpy(&local_48,&local_f8,__n);
      }
      if (uVar14 < 3) {
        memcpy(local_c8,local_d0,local_d8);
      }
      dVar5 = (local_90 - local_c0) - (local_78 - local_a8);
      dVar6 = (local_70 - local_a0) - (local_80 - local_b0);
      dVar7 = (local_68 - local_98) - (local_88 - local_b8);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_48 * local_48;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_48 * local_40;
      auVar17 = vunpcklpd_avx(auVar30,auVar32);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_48 * local_38;
      auVar24 = vunpcklpd_avx(auVar28,auVar32);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_40 * local_38;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_40 * local_40;
      auVar27 = vunpcklpd_avx(auVar34,auVar29);
      auVar20 = vunpcklpd_avx(auVar28,auVar29);
      plVar12[0x12] = (long)(local_108 * auVar17._0_8_ + (double)plVar12[0x12]);
      plVar12[0x13] = (long)(local_108 * auVar17._8_8_ + (double)plVar12[0x13]);
      plVar12[0x14] = (long)(local_108 * auVar24._0_8_ + (double)plVar12[0x14]);
      plVar12[0x15] = (long)(local_108 * auVar24._8_8_ + (double)plVar12[0x15]);
      plVar12[0x16] = (long)(auVar27._0_8_ * local_108 + (double)plVar12[0x16]);
      plVar12[0x17] = (long)(auVar27._8_8_ * local_108 + (double)plVar12[0x17]);
      plVar12[0x18] = (long)(local_108 * auVar20._0_8_ + (double)plVar12[0x18]);
      plVar12[0x19] = (long)(local_108 * auVar20._8_8_ + (double)plVar12[0x19]);
      plVar12[0x1a] = (long)(local_108 * local_38 * local_38 + (double)plVar12[0x1a]);
      auVar33._8_8_ = local_118;
      auVar33._0_8_ = local_118;
      plVar13[0x12] = (long)(local_118 * auVar17._0_8_ + (double)plVar13[0x12]);
      plVar13[0x13] = (long)(local_118 * auVar17._8_8_ + (double)plVar13[0x13]);
      plVar13[0x14] = (long)(local_118 * auVar24._0_8_ + (double)plVar13[0x14]);
      plVar13[0x15] = (long)(local_118 * auVar24._8_8_ + (double)plVar13[0x15]);
      plVar13[0x16] = (long)(auVar27._0_8_ * local_118 + (double)plVar13[0x16]);
      plVar13[0x17] = (long)(auVar27._8_8_ * local_118 + (double)plVar13[0x17]);
      plVar13[0x18] = (long)(local_118 * auVar20._0_8_ + (double)plVar13[0x18]);
      plVar13[0x19] = (long)(local_118 * auVar20._8_8_ + (double)plVar13[0x19]);
      plVar13[0x1a] = (long)(local_118 * local_38 * local_38 + (double)plVar13[0x1a]);
      dVar18 = local_50 * local_108;
      dVar1 = local_58 * local_108;
      local_108 = local_60 * local_108;
      auVar8._8_8_ = 0x8000000000000000;
      auVar8._0_8_ = 0x8000000000000000;
      auVar17 = vxorpd_avx512vl(auVar33,auVar8);
      dVar31 = auVar17._0_8_;
      dVar19 = local_50 * dVar31;
      dVar4 = local_58 * dVar31;
      dVar31 = local_60 * dVar31;
      plVar12[0x1b] = (long)(dVar5 * dVar18 + (double)plVar12[0x1b]);
      plVar12[0x1e] = (long)(dVar5 * dVar1 + (double)plVar12[0x1e]);
      plVar12[0x21] = (long)(dVar5 * local_108 + (double)plVar12[0x21]);
      plVar12[0x1c] = (long)(dVar6 * dVar18 + (double)plVar12[0x1c]);
      plVar12[0x1f] = (long)(dVar6 * dVar1 + (double)plVar12[0x1f]);
      plVar12[0x22] = (long)(dVar6 * local_108 + (double)plVar12[0x22]);
      plVar12[0x1d] = (long)(dVar7 * dVar18 + (double)plVar12[0x1d]);
      plVar12[0x20] = (long)(dVar7 * dVar1 + (double)plVar12[0x20]);
      plVar12[0x23] = (long)(dVar7 * local_108 + (double)plVar12[0x23]);
      plVar13[0x1b] = (long)((double)plVar13[0x1b] - dVar5 * dVar19);
      plVar13[0x1e] = (long)((double)plVar13[0x1e] - dVar4 * dVar5);
      plVar13[0x21] = (long)((double)plVar13[0x21] - dVar5 * dVar31);
      plVar13[0x1c] = (long)((double)plVar13[0x1c] - dVar6 * dVar19);
      plVar13[0x1f] = (long)((double)plVar13[0x1f] - dVar4 * dVar6);
      plVar13[0x22] = (long)((double)plVar13[0x22] - dVar6 * dVar31);
      plVar13[0x1d] = (long)((double)plVar13[0x1d] - dVar7 * dVar19);
      plVar13[0x20] = (long)((double)plVar13[0x20] - dVar4 * dVar7);
      plVar13[0x23] = (long)((double)plVar13[0x23] - dVar7 * dVar31);
      p_Var15 = p_Var15->_M_next;
    } while (p_Var15 != (_List_node_base *)&this->proximitylist);
  }
  return;
}

Assistant:

void ChProximityContainerMeshless::AccumulateStep1() {
    // Per-edge data computation
    std::list<ChProximityMeshless*>::iterator iterproximity = proximitylist.begin();
    while (iterproximity != proximitylist.end()) {
        ChNodeMeshless* mnodeA = dynamic_cast<ChNodeMeshless*>((*iterproximity)->GetModelA()->GetContactable());
        ChNodeMeshless* mnodeB = dynamic_cast<ChNodeMeshless*>((*iterproximity)->GetModelB()->GetContactable());

        ChVector<> x_A = mnodeA->GetPos();
        ChVector<> x_B = mnodeB->GetPos();
        ChVector<> x_Aref = mnodeA->GetPosReference();
        ChVector<> x_Bref = mnodeB->GetPosReference();
        ChVector<> u_A = (x_A - x_Aref);
        ChVector<> u_B = (x_B - x_Bref);

        ChVector<> d_BA = x_Bref - x_Aref;
        ChVector<> g_BA = u_B - u_A;
        double dist_BA = d_BA.Length();
        double W_BA = W_sph(dist_BA, mnodeA->GetKernelRadius());
        double W_AB = W_sph(dist_BA, mnodeB->GetKernelRadius());

        // increment data of connected nodes

        mnodeA->density += mnodeB->GetMass() * W_BA;
        mnodeB->density += mnodeA->GetMass() * W_AB;

        ChVectorN<double, 3> mdist;
        mdist.segment(0,3) = d_BA.eigen();
        
        ChMatrix33<> ddBA = mdist * mdist.transpose();        
        ChMatrix33<> ddAB(ddBA);

        mnodeA->Amoment += W_BA * ddBA;  // increment the moment matrix: Aa += d_BA*d_BA'*W_BA
        mnodeB->Amoment += W_AB * ddAB;  // increment the moment matrix: Ab += d_AB*d_AB'*W_AB

        ChVector<> m_inc_BA = W_BA * d_BA;
        ChVector<> m_inc_AB = -W_AB * d_BA;

        // increment the J matrix
        mnodeA->J.col(0) += g_BA.x() * m_inc_BA.eigen();
        mnodeA->J.col(1) += g_BA.y() * m_inc_BA.eigen();
        mnodeA->J.col(2) += g_BA.z() * m_inc_BA.eigen();

        // increment the J matrix
        mnodeB->J.col(0) -= g_BA.x() * m_inc_AB.eigen();
        mnodeB->J.col(1) -= g_BA.y() * m_inc_AB.eigen();
        mnodeB->J.col(2) -= g_BA.z() * m_inc_AB.eigen();

        ++iterproximity;
    }
}